

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O0

error<idx2::err_code> idx2::ReadMetaData(cstr FileName,metadata *Meta)

{
  bool bVar1;
  dtype dVar2;
  size_t sVar3;
  error<idx2::err_code> eVar4;
  stref sVar5;
  error<idx2::err_code> eVar6;
  error<idx2::err_code> eVar7;
  error<idx2::err_code> eVar8;
  error<idx2::err_code> eVar9;
  err_code local_4f8;
  undefined2 uStack_4f4;
  anon_class_1_0_00000001 local_4e9;
  anon_union_8_2_2df48d06_for_stref_0 local_4e8;
  int local_4e0;
  anon_union_8_2_2df48d06_for_stref_0 local_4d8;
  int local_4d0;
  error<idx2::err_code> local_4c8;
  anon_class_8_1_bfec4fc5 local_4b8;
  error<idx2::err_code> local_4b0;
  anon_class_8_1_bfec4fc5 local_4a0;
  anon_union_8_2_2df48d06_for_stref_0 local_498;
  undefined4 uStack_490;
  StringTo<idx2::dtype> local_479;
  anon_union_8_2_2df48d06_for_stref_0 local_478;
  undefined4 local_470;
  error<idx2::err_code> local_468;
  anon_class_8_1_bfec4fc5 local_458;
  anon_union_8_2_2df48d06_for_stref_0 local_450;
  int local_448;
  anon_union_8_2_2df48d06_for_stref_0 local_440;
  int local_438;
  error<idx2::err_code> local_430;
  anon_class_8_1_bfec4fc5 local_420;
  anon_union_8_2_2df48d06_for_stref_0 local_418;
  int local_410;
  anon_union_8_2_2df48d06_for_stref_0 local_408;
  stref Dim;
  char *pcStack_3f0;
  int D;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  anon_union_8_2_2df48d06_for_stref_0 local_3e0;
  tokenizer TkSpace;
  anon_union_8_2_2df48d06_for_stref_0 local_398;
  int local_390;
  anon_union_8_2_2df48d06_for_stref_0 local_388;
  stref FieldStr;
  anon_union_8_2_2df48d06_for_stref_0 local_358;
  int local_350;
  anon_union_8_2_2df48d06_for_stref_0 local_348;
  stref NameStr;
  err_code local_318;
  undefined2 uStack_314;
  anon_class_8_1_bfec4fc5 local_310;
  anon_union_8_2_2df48d06_for_stref_0 local_308;
  int local_300;
  anon_union_8_2_2df48d06_for_stref_0 local_2f8;
  int local_2f0;
  anon_union_8_2_2df48d06_for_stref_0 local_2e8;
  int local_2e0;
  anon_union_8_2_2df48d06_for_stref_0 aStack_2d8;
  stref Value;
  anon_union_8_2_2df48d06_for_stref_0 local_2a8;
  int local_2a0;
  anon_union_8_2_2df48d06_for_stref_0 local_298;
  stref Attr;
  anon_union_8_2_2df48d06_for_stref_0 local_278;
  tokenizer TkEq;
  anon_union_8_2_2df48d06_for_stref_0 local_240;
  stref Line;
  anon_union_8_2_2df48d06_for_stref_0 local_220;
  tokenizer TkLine;
  anon_union_8_2_2df48d06_for_stref_0 local_1e8;
  stref Str;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_DataSet_cpp:83:3)>
  __ScopeGuard__0;
  anon_class_8_1_ba1cc1b3_for_Func __CleanUpFunc__0;
  err_code local_1b8;
  undefined2 uStack_1b4;
  error<idx2::err_code> Ok;
  buffer Buf;
  metadata *Meta_local;
  cstr FileName_local;
  err_code local_170;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  char *local_168;
  int *local_160;
  char *local_158;
  int *local_150;
  char *local_148;
  int *local_140;
  char *local_138;
  int *local_130;
  char *local_128;
  int *local_120;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  anon_union_8_2_2df48d06_for_stref_0 *local_100;
  mallocator *local_f8;
  err_code *local_f0;
  undefined4 local_e4;
  err_code local_e0;
  i8 iStack_dc;
  bool bStack_db;
  undefined2 uStack_da;
  anon_union_8_2_2df48d06_for_stref_0 *local_d8;
  undefined4 local_cc;
  metadata *local_c8;
  anon_union_8_2_2df48d06_for_stref_0 *local_c0;
  undefined4 local_b4;
  char *local_b0;
  anon_union_8_2_2df48d06_for_stref_0 *local_a8;
  int *local_a0;
  anon_union_8_2_2df48d06_for_stref_0 *local_98;
  anon_union_8_2_2df48d06_for_stref_0 *local_90;
  int *local_88;
  anon_union_8_2_2df48d06_for_stref_0 *local_80;
  anon_union_8_2_2df48d06_for_stref_0 *local_78;
  undefined1 *local_70;
  anon_union_8_2_2df48d06_for_stref_0 *local_68;
  anon_union_8_2_2df48d06_for_stref_0 *local_60;
  anon_union_8_2_2df48d06_for_stref_0 *local_58;
  anon_union_8_2_2df48d06_for_stref_0 *local_50;
  anon_union_8_2_2df48d06_for_stref_0 *local_48;
  anon_union_8_2_2df48d06_for_stref_0 *local_40;
  undefined4 local_34;
  v3i *local_30;
  undefined4 local_24;
  v3i *local_20;
  undefined4 local_14;
  v3i *local_10;
  
  Meta_local = (metadata *)FileName;
  local_f8 = Mallocator();
  local_f0 = &Ok.Code;
  Ok.Code = NoError;
  Ok.StackIdx = '\0';
  Ok.StrGened = false;
  Ok._14_2_ = 0;
  eVar4 = ReadFile(Meta_local->Name,(buffer *)local_f0);
  __CleanUpFunc__0.Buf = (buffer *)eVar4.Msg;
  local_1b8 = eVar4.Code;
  Ok.Msg._0_4_ = local_1b8;
  uStack_1b4 = eVar4._12_2_;
  Ok.Msg._4_2_ = uStack_1b4;
  if (local_1b8 == NoError) {
    __ScopeGuard__0._8_8_ = &Ok.Code;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp:83:3)>
    ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_DataSet_cpp:83:3)>
                   *)&Str.Size,(anon_class_8_1_ba1cc1b3_for_Func *)&__ScopeGuard__0.Dismissed);
    local_d8 = &local_1e8;
    local_e0 = Ok.Code;
    iStack_dc = Ok.StackIdx;
    bStack_db = Ok.StrGened;
    uStack_da = Ok._14_2_;
    local_e4 = 0;
    local_1e8 = (anon_union_8_2_2df48d06_for_stref_0)Ok._8_8_;
    local_160 = &Line.Size;
    local_168 = "\r\n";
    Line._8_8_ = anon_var_dwarf_10eba;
    Str.field_0._0_4_ = local_e4;
    strlen("\r\n");
    local_90 = &local_220;
    local_98 = &local_1e8;
    local_a0 = &Line.Size;
    local_220 = local_1e8;
    TkLine.Input.field_0._4_4_ = Str.field_0._4_4_;
    TkLine.Input.field_0._0_4_ = Str.field_0._0_4_;
    TkLine.Input.Size = Line.Size;
    TkLine.Input._12_4_ = Line._12_4_;
    TkLine.Delims.Size = 0;
    sVar5 = Next((tokenizer *)&local_220);
    Line.field_0._0_4_ = sVar5.Size;
    TkEq._32_8_ = sVar5.field_0;
    local_240 = (anon_union_8_2_2df48d06_for_stref_0)TkEq._32_8_;
    while (local_40 = &local_240, local_240.Ptr != (str)0x0) {
      local_150 = &Attr.Size;
      local_158 = "=";
      Attr._8_8_ = (long)" =" + 1;
      strlen("=");
      local_78 = &local_278;
      local_80 = &local_240;
      local_88 = &Attr.Size;
      local_278.Ptr = local_240.Ptr;
      TkEq.Input.field_0._4_4_ = Line.field_0._4_4_;
      TkEq.Input.field_0._0_4_ = Line.field_0._0_4_;
      TkEq.Input.Size = Attr.Size;
      TkEq.Input._12_4_ = Attr._12_4_;
      TkEq.Delims.Size = 0;
      sVar5 = Next((tokenizer *)&local_278);
      local_2a8 = sVar5.field_0;
      local_2a0 = sVar5.Size;
      sVar5 = Trim((stref *)&local_2a8);
      Value._8_8_ = sVar5.field_0;
      Attr.field_0._0_4_ = sVar5.Size;
      local_298 = (anon_union_8_2_2df48d06_for_stref_0)Value._8_8_;
      sVar5 = Next((tokenizer *)&local_278);
      local_2f8 = sVar5.field_0;
      local_2f0 = sVar5.Size;
      local_2e8 = local_2f8;
      local_2e0 = local_2f0;
      sVar5 = Trim((stref *)&local_2e8);
      local_308 = sVar5.field_0;
      local_300 = sVar5.Size;
      local_48 = &local_298;
      aStack_2d8 = local_308;
      Value.field_0._0_4_ = local_300;
      if ((local_298.Ptr == (str)0x0) || (local_50 = &aStack_2d8, local_308.Ptr == (str)0x0)) {
        local_310.FileName = (cstr *)&Meta_local;
        eVar9 = ReadMetaData::anon_class_8_1_bfec4fc5::operator()(&local_310);
        eVar8.Code = local_4c8.Code;
        eVar8.StackIdx = local_4c8.StackIdx;
        eVar8.StrGened = local_4c8.StrGened;
        eVar8._14_2_ = local_4c8._14_2_;
        eVar8.Msg = local_4c8.Msg;
        eVar7.Code = local_4b0.Code;
        eVar7.StackIdx = local_4b0.StackIdx;
        eVar7.StrGened = local_4b0.StrGened;
        eVar7._14_2_ = local_4b0._14_2_;
        eVar7.Msg = local_4b0.Msg;
        eVar6.Code = local_468.Code;
        eVar6.StackIdx = local_468.StackIdx;
        eVar6.StrGened = local_468.StrGened;
        eVar6._14_2_ = local_468._14_2_;
        eVar6.Msg = local_468.Msg;
        eVar4.Code = local_430.Code;
        eVar4.StackIdx = local_430.StackIdx;
        eVar4.StrGened = local_430.StrGened;
        eVar4._14_2_ = local_430._14_2_;
        eVar4.Msg = local_430.Msg;
        FileName_local = eVar9.Msg;
        local_318 = eVar9.Code;
        local_170 = local_318;
        uStack_314 = eVar9._12_2_;
        uStack_16c = uStack_314;
        goto LAB_0010e3c3;
      }
      local_140 = &NameStr.Size;
      local_148 = "name";
      NameStr._8_8_ = (long)"--name" + 2;
      strlen("name");
      bVar1 = operator==((stref *)&local_298,(stref *)&NameStr.Size);
      if (bVar1) {
        local_c0 = &local_348;
        local_cc = 0x3f;
        NameStr.field_0._0_4_ = 0x3f;
        local_c8 = Meta;
        local_348 = (anon_union_8_2_2df48d06_for_stref_0)Meta;
        sVar5 = Trim((stref *)&aStack_2d8);
        local_358 = sVar5.field_0;
        local_350 = sVar5.Size;
        Copy((stref *)&local_358,(stref *)&local_348,true);
      }
      else {
        local_130 = &FieldStr.Size;
        local_138 = "field";
        FieldStr._8_8_ = (long)"--field" + 2;
        strlen("field");
        bVar1 = operator==((stref *)&local_298,(stref *)&FieldStr.Size);
        if (bVar1) {
          local_b0 = Meta->Field;
          local_a8 = &local_388;
          local_b4 = 0x3f;
          FieldStr.field_0._0_4_ = 0x3f;
          local_388 = (anon_union_8_2_2df48d06_for_stref_0)local_b0;
          sVar5 = Trim((stref *)&aStack_2d8);
          local_398 = sVar5.field_0;
          local_390 = sVar5.Size;
          Copy((stref *)&local_398,(stref *)&local_388,true);
        }
        else {
          local_120 = &TkSpace.Pos;
          local_128 = "dimensions";
          TkSpace._32_8_ = anon_var_dwarf_10f06;
          strlen("dimensions");
          bVar1 = operator==((stref *)&local_298,(stref *)&TkSpace.Pos);
          if (bVar1) {
            local_110 = (undefined1 *)&stack0xfffffffffffffc10;
            local_118 = " ";
            pcStack_3f0 = " ";
            sVar3 = strlen(" ");
            local_60 = &local_3e0;
            local_68 = &aStack_2d8;
            local_70 = (undefined1 *)&stack0xfffffffffffffc10;
            local_3e0.Ptr = aStack_2d8.Ptr;
            TkSpace.Input.field_0._4_4_ = Value.field_0._4_4_;
            TkSpace.Input.field_0._0_4_ = Value.field_0._0_4_;
            TkSpace.Input._8_8_ = pcStack_3f0;
            TkSpace.Delims.field_0._4_4_ = uStack_3e4;
            TkSpace.Delims.field_0._0_4_ = local_3e8;
            TkSpace.Delims.Size = 0;
            Dim._12_4_ = 0;
            local_3e8 = (int)sVar3;
            sVar5 = Next((tokenizer *)&local_3e0);
            local_410 = sVar5.Size;
            local_418 = sVar5.field_0;
            local_408 = local_418;
            Dim.field_0._0_4_ = local_410;
            while (local_58 = &local_408, local_408.Ptr != (str)0x0 && (int)Dim._12_4_ < 4) {
              local_10 = &Meta->Dims3;
              local_14 = Dim._12_4_;
              if (2 < (int)Dim._12_4_) {
                __assert_fail("Idx < 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
              }
              bVar1 = ToInt((stref *)&local_408,(local_10->field_0).E + (int)Dim._12_4_);
              if (!bVar1) {
                local_420.FileName = (cstr *)&Meta_local;
                eVar4 = ReadMetaData::anon_class_8_1_bfec4fc5::operator()(&local_420);
                eVar8.Code = local_4c8.Code;
                eVar8.StackIdx = local_4c8.StackIdx;
                eVar8.StrGened = local_4c8.StrGened;
                eVar8._14_2_ = local_4c8._14_2_;
                eVar8.Msg = local_4c8.Msg;
                eVar7.Code = local_4b0.Code;
                eVar7.StackIdx = local_4b0.StackIdx;
                eVar7.StrGened = local_4b0.StrGened;
                eVar7._14_2_ = local_4b0._14_2_;
                eVar7.Msg = local_4b0.Msg;
                eVar6.Code = local_468.Code;
                eVar6.StackIdx = local_468.StackIdx;
                eVar6.StrGened = local_468.StrGened;
                eVar6._14_2_ = local_468._14_2_;
                eVar6.Msg = local_468.Msg;
                FileName_local = eVar4.Msg;
                local_430.Code = eVar4.Code;
                local_170 = local_430.Code;
                local_430._12_2_ = eVar4._12_2_;
                uStack_16c._0_1_ = local_430.StackIdx;
                uStack_16c._1_1_ = local_430.StrGened;
                goto LAB_0010e3c3;
              }
              sVar5 = Next((tokenizer *)&local_3e0);
              local_448 = sVar5.Size;
              Dim._12_4_ = Dim._12_4_ + 1;
              local_450 = sVar5.field_0;
              local_440 = local_450;
              local_438 = local_448;
              Dim.field_0._0_4_ = local_448;
              local_408 = local_450;
            }
            if (3 < (int)Dim._12_4_) {
              local_458.FileName = (cstr *)&Meta_local;
              eVar6 = ReadMetaData::anon_class_8_1_bfec4fc5::operator()(&local_458);
              eVar8.Code = local_4c8.Code;
              eVar8.StackIdx = local_4c8.StackIdx;
              eVar8.StrGened = local_4c8.StrGened;
              eVar8._14_2_ = local_4c8._14_2_;
              eVar8.Msg = local_4c8.Msg;
              eVar7.Code = local_4b0.Code;
              eVar7.StackIdx = local_4b0.StackIdx;
              eVar7.StrGened = local_4b0.StrGened;
              eVar7._14_2_ = local_4b0._14_2_;
              eVar7.Msg = local_4b0.Msg;
              eVar4.Code = local_430.Code;
              eVar4.StackIdx = local_430.StackIdx;
              eVar4.StrGened = local_430.StrGened;
              eVar4._14_2_ = local_430._14_2_;
              eVar4.Msg = local_430.Msg;
              FileName_local = eVar6.Msg;
              local_468.Code = eVar6.Code;
              local_170 = local_468.Code;
              local_468._12_2_ = eVar6._12_2_;
              uStack_16c._0_1_ = local_468.StackIdx;
              uStack_16c._1_1_ = local_468.StrGened;
              goto LAB_0010e3c3;
            }
            if ((int)Dim._12_4_ < 3) {
              local_20 = &Meta->Dims3;
              local_24 = 2;
              (Meta->Dims3).field_0.field_0.Z = 1;
            }
            if ((int)Dim._12_4_ < 2) {
              local_30 = &Meta->Dims3;
              local_34 = 1;
              (Meta->Dims3).field_0.field_0.Y = 1;
            }
          }
          else {
            local_100 = &local_478;
            local_108 = "type";
            local_478.Ptr = "type";
            sVar3 = strlen("type");
            local_470 = (undefined4)sVar3;
            bVar1 = operator==((stref *)&local_298,(stref *)&local_478);
            if (!bVar1) {
              local_4b8.FileName = (cstr *)&Meta_local;
              eVar8 = ReadMetaData::anon_class_8_1_bfec4fc5::operator()(&local_4b8);
              eVar7.Code = local_4b0.Code;
              eVar7.StackIdx = local_4b0.StackIdx;
              eVar7.StrGened = local_4b0.StrGened;
              eVar7._14_2_ = local_4b0._14_2_;
              eVar7.Msg = local_4b0.Msg;
              eVar6.Code = local_468.Code;
              eVar6.StackIdx = local_468.StackIdx;
              eVar6.StrGened = local_468.StrGened;
              eVar6._14_2_ = local_468._14_2_;
              eVar6.Msg = local_468.Msg;
              eVar4.Code = local_430.Code;
              eVar4.StackIdx = local_430.StackIdx;
              eVar4.StrGened = local_430.StrGened;
              eVar4._14_2_ = local_430._14_2_;
              eVar4.Msg = local_430.Msg;
              FileName_local = eVar8.Msg;
              local_4c8.Code = eVar8.Code;
              local_170 = local_4c8.Code;
              local_4c8._12_2_ = eVar8._12_2_;
              uStack_16c._0_1_ = local_4c8.StackIdx;
              uStack_16c._1_1_ = local_4c8.StrGened;
              goto LAB_0010e3c3;
            }
            local_498.Ptr = aStack_2d8.Ptr;
            uStack_490 = Value.field_0._0_4_;
            sVar5.Size = Value.field_0._0_4_;
            sVar5.field_0.Ptr = aStack_2d8.Ptr;
            sVar5._12_4_ = 0;
            dVar2 = StringTo<idx2::dtype>::operator()(&local_479,sVar5);
            Meta->DType = dVar2;
            if (dVar2 == __Invalid__) {
              local_4a0.FileName = (cstr *)&Meta_local;
              eVar7 = ReadMetaData::anon_class_8_1_bfec4fc5::operator()(&local_4a0);
              eVar8.Code = local_4c8.Code;
              eVar8.StackIdx = local_4c8.StackIdx;
              eVar8.StrGened = local_4c8.StrGened;
              eVar8._14_2_ = local_4c8._14_2_;
              eVar8.Msg = local_4c8.Msg;
              eVar6.Code = local_468.Code;
              eVar6.StackIdx = local_468.StackIdx;
              eVar6.StrGened = local_468.StrGened;
              eVar6._14_2_ = local_468._14_2_;
              eVar6.Msg = local_468.Msg;
              eVar4.Code = local_430.Code;
              eVar4.StackIdx = local_430.StackIdx;
              eVar4.StrGened = local_430.StrGened;
              eVar4._14_2_ = local_430._14_2_;
              eVar4.Msg = local_430.Msg;
              FileName_local = eVar7.Msg;
              local_4b0.Code = eVar7.Code;
              local_170 = local_4b0.Code;
              local_4b0._12_2_ = eVar7._12_2_;
              uStack_16c._0_1_ = local_4b0.StackIdx;
              uStack_16c._1_1_ = local_4b0.StrGened;
              goto LAB_0010e3c3;
            }
          }
        }
      }
      sVar5 = Next((tokenizer *)&local_220);
      local_4e0 = sVar5.Size;
      local_4e8 = sVar5.field_0;
      local_4d8 = local_4e8;
      local_4d0 = local_4e0;
      Line.field_0._0_4_ = local_4e0;
      local_240 = local_4e8;
    }
    eVar9 = ReadMetaData::anon_class_1_0_00000001::operator()(&local_4e9);
    eVar8.Code = local_4c8.Code;
    eVar8.StackIdx = local_4c8.StackIdx;
    eVar8.StrGened = local_4c8.StrGened;
    eVar8._14_2_ = local_4c8._14_2_;
    eVar8.Msg = local_4c8.Msg;
    eVar7.Code = local_4b0.Code;
    eVar7.StackIdx = local_4b0.StackIdx;
    eVar7.StrGened = local_4b0.StrGened;
    eVar7._14_2_ = local_4b0._14_2_;
    eVar7.Msg = local_4b0.Msg;
    eVar6.Code = local_468.Code;
    eVar6.StackIdx = local_468.StackIdx;
    eVar6.StrGened = local_468.StrGened;
    eVar6._14_2_ = local_468._14_2_;
    eVar6.Msg = local_468.Msg;
    eVar4.Code = local_430.Code;
    eVar4.StackIdx = local_430.StackIdx;
    eVar4.StrGened = local_430.StrGened;
    eVar4._14_2_ = local_430._14_2_;
    eVar4.Msg = local_430.Msg;
    FileName_local = eVar9.Msg;
    local_4f8 = eVar9.Code;
    local_170 = local_4f8;
    uStack_4f4 = eVar9._12_2_;
    uStack_16c = uStack_4f4;
LAB_0010e3c3:
    local_4c8 = eVar8;
    local_4b0 = eVar7;
    local_468 = eVar6;
    local_430 = eVar4;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp:83:3)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_DataSet_cpp:83:3)>
                    *)&Str.Size);
  }
  else {
    FileName_local = (cstr)__CleanUpFunc__0.Buf;
    uStack_16a = Ok.Msg._6_2_;
    local_170 = local_1b8;
    uStack_16c = uStack_1b4;
  }
  eVar9.Code = local_170;
  eVar9.Msg = FileName_local;
  eVar9.StackIdx = (undefined1)uStack_16c;
  eVar9.StrGened = (bool)uStack_16c._1_1_;
  eVar9._14_2_ = uStack_16a;
  return eVar9;
}

Assistant:

error<>
ReadMetaData(cstr FileName, metadata* Meta)
{
  buffer Buf;
  error Ok = ReadFile(FileName, &Buf);
  if (Ok.Code != err_code::NoError)
    return Ok;
  idx2_CleanUp(0, DeallocBuf(&Buf));
  stref Str((cstr)Buf.Data, (int)Buf.Bytes);
  tokenizer TkLine(Str, "\r\n");
  for (stref Line = Next(&TkLine); Line; Line = Next(&TkLine))
  {
    tokenizer TkEq(Line, "=");
    stref Attr = Trim(Next(&TkEq));
    stref Value = Trim(Next(&TkEq));
    if (!Attr || !Value)
      return idx2_Error(err_code::ParseFailed, "File %s", FileName);

    if (Attr == "name")
    {
      stref NameStr = idx2_StRef(Meta->Name);
      Copy(Trim(Value), &NameStr);
    }
    else if (Attr == "field")
    {
      stref FieldStr = idx2_StRef(Meta->Field);
      Copy(Trim(Value), &FieldStr);
    }
    else if (Attr == "dimensions")
    {
      tokenizer TkSpace(Value, " ");
      int D = 0;
      for (stref Dim = Next(&TkSpace); Dim && D < 4; Dim = Next(&TkSpace), ++D)
      {
        if (!ToInt(Dim, &Meta->Dims3[D]))
          return idx2_Error(err_code::ParseFailed, "File %s", FileName);
      }
      if (D >= 4)
        return idx2_Error(err_code::DimensionsTooMany, "File %s", FileName);
      if (D <= 2)
        Meta->Dims3[2] = 1;
      if (D <= 1)
        Meta->Dims3[1] = 1;
    }
    else if (Attr == "type")
    {
      if ((Meta->DType = StringTo<dtype>()(Value)) == dtype::__Invalid__)
        return idx2_Error(err_code::TypeNotSupported, "File %s", FileName);
    }
    else
    {
      return idx2_Error(err_code::AttributeNotFound, "File %s", FileName);
    }
  }
  return idx2_Error(err_code::NoError);
}